

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void GA_Freemem(void *ptr)

{
  long lVar1;
  long in_RDI;
  char **ptr_arr;
  getmem_t *info;
  int extra;
  
  lVar1 = GAnproc << 3;
  ARMCI_Free((void *)0x1e2669);
  if (GA_memory_limited != 0) {
    GA_total_memory = *(long *)((in_RDI - ((int)lVar1 + 0x20)) + 0x10) + GA_total_memory;
  }
  return;
}

Assistant:

void GA_Freemem(void *ptr)
{
int extra = sizeof(getmem_t)+GAnproc*sizeof(char*); 
getmem_t *info = (getmem_t *)((char*)ptr - extra);
char **ptr_arr = (char**)(info+1);

#ifndef AVOID_MA_STORAGE
    if(ARMCI_Uses_shm()){
#endif
      /* make sure that we free original (before address alignment) pointer */
      ARMCI_Free(ptr_arr[GAme] - info->id);
#ifndef AVOID_MA_STORAGE
    }else{
      if(info->id != INVALID_MA_HANDLE) MA_free_heap(info->id);
    }
#endif

    if(GA_memory_limited) GA_total_memory += info->size;
}